

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxUnaryNotBoolean::Resolve(FxUnaryNotBoolean *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxBoolCast *this_00;
  undefined4 extraout_var_00;
  FxConstant *this_01;
  FCompileContext *size;
  ExpVal EStack_38;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    size = ctx;
    iVar2 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Operand = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      if (pFVar3->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxBoolCast::FxBoolCast(this_00,this->Operand,true);
        this->Operand = (FxExpression *)this_00;
        iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        pFVar3 = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        this->Operand = pFVar3;
        if (pFVar3 == (FxExpression *)0x0) goto LAB_00509ad5;
      }
      iVar2 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
      if ((char)iVar2 != '\0') {
        pFVar3 = this->Operand + 1;
        ExpVal::ExpVal(&EStack_38,(ExpVal *)pFVar3);
        bVar1 = ExpVal::GetBool(&EStack_38);
        ExpVal::~ExpVal(&EStack_38);
        this_01 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar3);
        FxConstant::FxConstant(this_01,!bVar1,&(this->super_FxExpression).ScriptPosition);
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return &this_01->super_FxExpression;
      }
      (this->super_FxExpression).ValueType = (PType *)TypeBool;
      return &this->super_FxExpression;
    }
  }
LAB_00509ad5:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxUnaryNotBoolean::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->ValueType != TypeBool)
	{
		Operand = new FxBoolCast(Operand);
		SAFE_RESOLVE(Operand, ctx);
	}

	if (Operand->isConstant())
	{
		bool result = !static_cast<FxConstant *>(Operand)->GetValue().GetBool();
		FxExpression *e = new FxConstant(result, ScriptPosition);
		delete this;
		return e;
	}

	ValueType = TypeBool;
	return this;
}